

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

optional<ParsedGame> *
Parser::parse_from_string
          (optional<ParsedGame> *__return_storage_ptr__,string *p_text,
          shared_ptr<PSLogger> *p_logger)

{
  TextProviderString *this;
  shared_ptr<PSLogger> local_80;
  unique_ptr<TextProvider,_std::default_delete<TextProvider>_> local_70;
  undefined1 local_65;
  string local_58;
  shared_ptr<PSLogger> local_38;
  unique_ptr<TextProvider,_std::default_delete<TextProvider>_> local_28;
  unique_ptr<TextProvider,_std::default_delete<TextProvider>_> txt_provider;
  shared_ptr<PSLogger> *p_logger_local;
  string *p_text_local;
  
  txt_provider._M_t.super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>._M_t.
  super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>.
  super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl =
       (__uniq_ptr_data<TextProvider,_std::default_delete<TextProvider>,_true,_true>)
       (__uniq_ptr_data<TextProvider,_std::default_delete<TextProvider>,_true,_true>)p_logger;
  this = (TextProviderString *)operator_new(0x58);
  local_65 = 1;
  std::shared_ptr<PSLogger>::shared_ptr(&local_38,p_logger);
  std::__cxx11::string::string((string *)&local_58,(string *)p_text);
  TextProviderString::TextProviderString(this,&local_38,&local_58);
  local_65 = 0;
  std::unique_ptr<TextProvider,std::default_delete<TextProvider>>::
  unique_ptr<std::default_delete<TextProvider>,void>
            ((unique_ptr<TextProvider,std::default_delete<TextProvider>> *)&local_28,(pointer)this);
  std::__cxx11::string::~string((string *)&local_58);
  std::shared_ptr<PSLogger>::~shared_ptr(&local_38);
  std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::unique_ptr(&local_70,&local_28)
  ;
  std::shared_ptr<PSLogger>::shared_ptr(&local_80,p_logger);
  parse_from_text_provider(__return_storage_ptr__,&local_70,&local_80);
  std::shared_ptr<PSLogger>::~shared_ptr(&local_80);
  std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::~unique_ptr(&local_70);
  std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::~unique_ptr(&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::optional<ParsedGame> Parser::parse_from_string(string p_text, shared_ptr<PSLogger> p_logger)
{
	unique_ptr<TextProvider> txt_provider(new TextProviderString(p_logger,p_text));
	return parse_from_text_provider(move(txt_provider),p_logger);
}